

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLScanner::scanComment(XMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLCh toCheck;
  UnexpectedEOFException *this_00;
  XMLReader *this_01;
  XMLCh *pXVar3;
  XMLCh local_48 [4];
  XMLCh tmpBuf [9];
  int local_24;
  XMLCh nextCh;
  bool gotLeadingSurrogate;
  States curState;
  XMLBufBid bbComment;
  XMLScanner *this_local;
  
  bbComment.fMgr = (XMLBufferMgr *)this;
  XMLBufBid::XMLBufBid((XMLBufBid *)&nextCh,&this->fBufMgr);
  local_24 = 0;
  bVar2 = false;
  do {
    while( true ) {
      while( true ) {
        toCheck = ReaderMgr::getNextChar(&this->fReaderMgr);
        if (toCheck == L'\0') {
          emitError(this,UnterminatedComment);
          this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                     ,0x868,Gen_UnexpectedEOF,this->fMemoryManager);
          __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                      UnexpectedEOFException::~UnexpectedEOFException);
        }
        if (((ushort)toCheck < 0xd800) || (0xdbff < (ushort)toCheck)) {
          if (bVar2) {
            if (((ushort)toCheck < 0xdc00) || (0xdfff < (ushort)toCheck)) {
              emitError(this,Expected2ndSurrogateChar);
            }
          }
          else {
            this_01 = ReaderMgr::getCurrentReader(&this->fReaderMgr);
            bVar2 = XMLReader::isXMLChar(this_01,toCheck);
            if (!bVar2) {
              XMLString::binToText((uint)(ushort)toCheck,local_48,8,0x10,this->fMemoryManager);
              emitError(this,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
          bVar2 = false;
        }
        else if (bVar2) {
          emitError(this,Expected2ndSurrogateChar);
        }
        else {
          bVar2 = true;
        }
        if (local_24 != 0) break;
        if (toCheck == L'-') {
          local_24 = 1;
        }
        else {
          XMLBufBid::append((XMLBufBid *)&nextCh,toCheck);
        }
      }
      if (local_24 != 1) break;
      if (toCheck == L'-') {
        local_24 = 2;
      }
      else {
        XMLBufBid::append((XMLBufBid *)&nextCh,L'-');
        XMLBufBid::append((XMLBufBid *)&nextCh,toCheck);
        local_24 = 0;
      }
    }
  } while (local_24 != 2);
  if (toCheck == L'>') {
    if (this->fDocHandler != (XMLDocumentHandler *)0x0) {
      pXVar1 = this->fDocHandler;
      pXVar3 = XMLBufBid::getRawBuffer((XMLBufBid *)&nextCh);
      (*pXVar1->_vptr_XMLDocumentHandler[3])(pXVar1,pXVar3);
    }
    bVar2 = ElemStack::isEmpty(&this->fElemStack);
    if (!bVar2) {
      ElemStack::setCommentOrPISeen(&this->fElemStack);
    }
  }
  else {
    emitError(this,IllegalSequenceInComment);
    ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)&nextCh);
  return;
}

Assistant:

void XMLScanner::scanComment()
{

    enum States
    {
        InText
        , OneDash
        , TwoDashes
    };

    // Get a buffer for this
    XMLBufBid bbComment(&fBufMgr);

    //  Get the comment text into a temp buffer. Be sure to use temp buffer
    //  two here, since its to be used for stuff that is potentially longer
    //  than just a name.
    States curState = InText;
    bool gotLeadingSurrogate = false;
    while (true)
    {
        // Get the next character
        const XMLCh nextCh = fReaderMgr.getNextChar();

        //  Watch for an end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedComment);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        // Check for correct surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            if (gotLeadingSurrogate)
            {
                if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                    emitError(XMLErrs::Expected2ndSurrogateChar);
            }
            // Its got to at least be a valid XML character
            else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh)) {

                XMLCh tmpBuf[9];
                XMLString::binToText
                (
                    nextCh
                    , tmpBuf
                    , 8
                    , 16
                    , fMemoryManager
                );
                emitError(XMLErrs::InvalidCharacter, tmpBuf);
            }

            gotLeadingSurrogate = false;
        }

        if (curState == InText)
        {
            // If its a dash, go to OneDash state. Otherwise take as text
            if (nextCh == chDash)
                curState = OneDash;
            else
                bbComment.append(nextCh);
        }
        else if (curState == OneDash)
        {
            //  If its another dash, then we change to the two dashes states.
            //  Otherwise, we have to put in the deficit dash and the new
            //  character and go back to InText.
            if (nextCh == chDash)
            {
                curState = TwoDashes;
            }
            else
            {
                bbComment.append(chDash);
                bbComment.append(nextCh);
                curState = InText;
            }
        }
        else if (curState == TwoDashes)
        {
            // The next character must be the closing bracket
            if (nextCh != chCloseAngle)
            {
                emitError(XMLErrs::IllegalSequenceInComment);
                fReaderMgr.skipPastChar(chCloseAngle);
                return;
            }
            break;
        }
    }

    // If we have an available handler, call back with the comment.
    if (fDocHandler)
    {
        fDocHandler->docComment
        (
            bbComment.getRawBuffer()
        );
    }

    //mark comment is seen within the current element
    if (! fElemStack.isEmpty())
        fElemStack.setCommentOrPISeen();

}